

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateCommonBuilderMethods
          (MessageBuilderGenerator *this,Printer *printer)

{
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *pFVar1;
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *this_00;
  ushort uVar2;
  int iVar3;
  FieldDescriptor *pFVar4;
  long lVar5;
  OneofDescriptor *oneof;
  ushort *puVar6;
  Nullable<const_char_*> src;
  size_t n;
  bool bVar7;
  Descriptor *pDVar8;
  ImmutableFieldGenerator *pIVar9;
  reference ppVar10;
  OneofGeneratorInfo *pOVar11;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar12;
  Descriptor *descriptor;
  long lVar13;
  uint uVar14;
  long lVar15;
  char *pcVar16;
  iterator iVar17;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  const_iterator other;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  const_iterator other_00;
  string_view text_18;
  string_view text_19;
  string_view text_20;
  string_view text_21;
  char *force_builder_init;
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  Descriptor *local_80;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *local_78;
  Printer *local_70;
  int local_64;
  btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
  *local_60;
  string local_58;
  char *local_38;
  
  pDVar8 = this->descriptor_;
  pcVar16 = anon_var_dwarf_a22956 + 5;
  if (0 < pDVar8->field_count_) {
    lVar13 = 0;
    lVar15 = 0;
    do {
      pDVar8 = FieldDescriptor::message_type
                         ((FieldDescriptor *)(&pDVar8->fields_->super_SymbolBase + lVar13));
      if (pDVar8 != (Descriptor *)0x0) {
        if (this->descriptor_->field_count_ <= lVar15) {
          GenerateCommonBuilderMethods();
LAB_00e6ccdc:
          GenerateCommonBuilderMethods();
          goto LAB_00e6cce9;
        }
        bVar7 = IsRealOneof((FieldDescriptor *)
                            (&this->descriptor_->fields_->super_SymbolBase + lVar13));
        if (!bVar7) {
          if (this->descriptor_->field_count_ <= lVar15) goto LAB_00e6ccdc;
          pFVar4 = this->descriptor_->fields_;
          bVar7 = FieldDescriptor::has_presence
                            ((FieldDescriptor *)(&pFVar4->super_SymbolBase + lVar13));
          if (bVar7) {
            if (((&pFVar4->field_0x3)[lVar13] & 1) == 0) {
              pDVar8 = this->descriptor_;
              pcVar16 = "  maybeForceBuilderInitialization();";
              bVar7 = true;
              goto LAB_00e6c446;
            }
            if (((&pFVar4->field_0x1)[lVar13] & 0x10) == 0) {
              protobuf::internal::protobuf_assumption_failed
                        ("res != nullptr",
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb63);
            }
            lVar5 = *(long *)((long)&pFVar4->scope_ + lVar13);
            if (lVar5 == 0) goto LAB_00e6cd0d;
            if ((*(int *)(lVar5 + 4) == 1) && ((*(byte *)(*(long *)(lVar5 + 0x30) + 1) & 2) != 0))
            goto LAB_00e6cd03;
          }
        }
      }
      lVar15 = lVar15 + 1;
      pDVar8 = this->descriptor_;
      lVar13 = lVar13 + 0x58;
    } while (lVar15 < pDVar8->field_count_);
  }
  bVar7 = false;
LAB_00e6c446:
  local_38 = pcVar16;
  ClassNameResolver::GetClassName_abi_cxx11_((string *)local_a0,this->name_resolver_,pDVar8,true);
  text._M_str = 
  "// Construct using $classname$.newBuilder()\nprivate Builder() {\n$force_builder_init$\n}\n\n";
  text._M_len = 0x58;
  io::Printer::Print<char[10],std::__cxx11::string,char[19],char_const*>
            (printer,text,(char (*) [10])0x13005f3,(string *)local_a0,
             (char (*) [19])"force_builder_init",&local_38);
  if ((btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
       *)local_a0._0_8_ !=
      (btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
       *)(local_a0 + 0x10)) {
    operator_delete((void *)local_a0._0_8_,
                    CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_a0,this->name_resolver_,this->descriptor_,true);
  text_00._M_str =
       "private Builder(\n    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n  super(parent);\n$force_builder_init$\n}\n"
  ;
  text_00._M_len = 0x7a;
  io::Printer::Print<char[10],std::__cxx11::string,char[19],char_const*>
            (printer,text_00,(char (*) [10])0x13005f3,(string *)local_a0,
             (char (*) [19])"force_builder_init",&local_38);
  if ((btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
       *)local_a0._0_8_ !=
      (btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
       *)(local_a0 + 0x10)) {
    operator_delete((void *)local_a0._0_8_,
                    CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
  }
  if (bVar7) {
    text_01._M_str =
         "private void maybeForceBuilderInitialization() {\n  if (com.google.protobuf.GeneratedMessage\n          .alwaysUseFieldBuilders) {\n"
    ;
    text_01._M_len = 0x81;
    io::Printer::Print<>(printer,text_01);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent * 2;
    pDVar8 = this->descriptor_;
    if (0 < pDVar8->field_count_) {
      lVar13 = 0;
      lVar15 = 0;
      do {
        bVar7 = IsRealOneof((FieldDescriptor *)(&pDVar8->fields_->super_SymbolBase + lVar13));
        if (!bVar7) {
          if (this->descriptor_->field_count_ <= lVar15) goto LAB_00e6cce9;
          pIVar9 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                             (&this->field_generators_,
                              (FieldDescriptor *)
                              (&this->descriptor_->fields_->super_SymbolBase + lVar13));
          (*(pIVar9->super_FieldGenerator)._vptr_FieldGenerator[0x10])(pIVar9,printer);
        }
        lVar15 = lVar15 + 1;
        pDVar8 = this->descriptor_;
        lVar13 = lVar13 + 0x58;
      } while (lVar15 < pDVar8->field_count_);
    }
    io::Printer::Outdent(printer);
    io::Printer::Outdent(printer);
    text_02._M_str = "  }\n}\n";
    text_02._M_len = 6;
    io::Printer::Print<>(printer,text_02);
  }
  text_03._M_str = "@java.lang.Override\npublic Builder clear() {\n  super.clear();\n";
  text_03._M_len = 0x3e;
  io::Printer::Print<>(printer,text_03);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  iVar3 = this->descriptor_->field_count_;
  local_80 = (Descriptor *)this;
  local_70 = printer;
  if (0 < iVar3) {
    uVar14 = 0;
    uVar12 = extraout_RDX;
    do {
      GetBitFieldName_abi_cxx11_((string *)local_a0,(java *)(ulong)uVar14,(int)uVar12);
      text_04._M_str = "$bit_field_name$ = 0;\n";
      text_04._M_len = 0x16;
      io::Printer::Print<char[15],std::__cxx11::string>
                (local_70,text_04,(char (*) [15])"bit_field_name",(string *)local_a0);
      uVar12 = extraout_RDX_00;
      if ((btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
           *)local_a0._0_8_ !=
          (btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
           *)(local_a0 + 0x10)) {
        operator_delete((void *)local_a0._0_8_,
                        CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1)
        ;
        uVar12 = extraout_RDX_01;
      }
      printer = local_70;
      this = (MessageBuilderGenerator *)local_80;
      uVar14 = uVar14 + 1;
    } while (iVar3 + 0x1fU >> 5 != uVar14);
    pDVar8 = *(Descriptor **)&local_80->field_count_;
    if (0 < pDVar8->field_count_) {
      pFVar1 = (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *)
               &local_80->containing_type_;
      lVar13 = 0;
      lVar15 = 0;
      do {
        pIVar9 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (pFVar1,(FieldDescriptor *)(&pDVar8->fields_->super_SymbolBase + lVar13))
        ;
        (*(pIVar9->super_FieldGenerator)._vptr_FieldGenerator[0xb])(pIVar9,printer);
        lVar15 = lVar15 + 1;
        pDVar8 = *(Descriptor **)&((Descriptor *)this)->field_count_;
        lVar13 = lVar13 + 0x58;
      } while (lVar15 < pDVar8->field_count_);
    }
  }
  this_00 = (btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
             *)&((Descriptor *)this)->fields_;
  iVar17 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
           ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                    *)this_00);
  local_a0._0_8_ = iVar17.node_;
  local_a0._8_4_ = iVar17.position_;
  local_78 = (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *)this_00
  ;
  iVar17 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
           ::end((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                  *)this_00);
  bVar7 = absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
          ::Equals((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                    *)local_a0,(const_iterator)iVar17);
  if (!bVar7) {
    do {
      ppVar10 = absl::lts_20250127::container_internal::
                btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                             *)local_a0);
      pOVar11 = Context::GetOneofGeneratorInfo
                          ((Context *)(((Descriptor *)this)->all_names_).payload_,ppVar10->second);
      text_05._M_str = "$oneof_name$Case_ = 0;\n$oneof_name$_ = null;\n";
      text_05._M_len = 0x2d;
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,text_05,(char (*) [11])0x12e0c8e,&pOVar11->name);
      absl::lts_20250127::container_internal::
      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
      ::increment((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                   *)local_a0);
      other._12_4_ = 0;
      other.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                     *)SUB128(iVar17._0_12_,0);
      other.position_ = SUB124(iVar17._0_12_,8);
      bVar7 = absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
              ::Equals((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                        *)local_a0,other);
    } while (!bVar7);
  }
  io::Printer::Outdent(printer);
  text_06._M_str = "  return this;\n}\n\n";
  text_06._M_len = 0x12;
  io::Printer::Print<>(printer,text_06);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_a0,(ClassNameResolver *)((Descriptor *)this)->file_,
             (*(Descriptor **)&((Descriptor *)this)->field_count_)->file_,true);
  UniqueFileScopeIdentifier_abi_cxx11_
            (&local_58,(java *)*(Descriptor **)&((Descriptor *)this)->field_count_,descriptor);
  text_07._M_str =
       "@java.lang.Override\npublic com.google.protobuf.Descriptors.Descriptor\n    getDescriptorForType() {\n  return $fileclass$.internal_$identifier$_descriptor;\n}\n\n"
  ;
  text_07._M_len = 0x9d;
  io::Printer::Print<char[10],std::__cxx11::string,char[11],std::__cxx11::string>
            (printer,text_07,(char (*) [10])"fileclass",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
             (char (*) [11])"identifier",&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
       *)local_a0._0_8_ !=
      (btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
       *)(local_a0 + 0x10)) {
    operator_delete((void *)local_a0._0_8_,
                    CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_a0,(ClassNameResolver *)local_80->file_,
             *(Descriptor **)&local_80->field_count_,true);
  text_08._M_str =
       "@java.lang.Override\npublic $classname$ getDefaultInstanceForType() {\n  return $classname$.getDefaultInstance();\n}\n\n"
  ;
  text_08._M_len = 0x73;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_08,(char (*) [10])0x13005f3,(string *)local_a0);
  if ((btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
       *)local_a0._0_8_ !=
      (btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
       *)(local_a0 + 0x10)) {
    operator_delete((void *)local_a0._0_8_,
                    CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_a0,(ClassNameResolver *)local_80->file_,
             *(Descriptor **)&local_80->field_count_,true);
  text_09._M_str =
       "@java.lang.Override\npublic $classname$ build() {\n  $classname$ result = buildPartial();\n  if (!result.isInitialized()) {\n    throw newUninitializedMessageException(result);\n  }\n  return result;\n}\n\n"
  ;
  text_09._M_len = 0xc5;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_09,(char (*) [10])0x13005f3,(string *)local_a0);
  if ((btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
       *)local_a0._0_8_ !=
      (btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
       *)(local_a0 + 0x10)) {
    operator_delete((void *)local_a0._0_8_,
                    CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
  }
  pDVar8 = local_80;
  GenerateBuildPartial((MessageBuilderGenerator *)local_80,printer);
  bVar7 = Context::HasGeneratedMethods
                    ((Context *)(pDVar8->all_names_).payload_,*(Descriptor **)&pDVar8->field_count_)
  ;
  if (bVar7) {
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)local_a0,(ClassNameResolver *)pDVar8->file_,
               *(Descriptor **)&pDVar8->field_count_,true);
    text_10._M_str =
         "@java.lang.Override\npublic Builder mergeFrom(com.google.protobuf.Message other) {\n  if (other instanceof $classname$) {\n    return mergeFrom(($classname$)other);\n  } else {\n    super.mergeFrom(other);\n    return this;\n  }\n}\n\n"
    ;
    text_10._M_len = 0xe1;
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,text_10,(char (*) [10])0x13005f3,(string *)local_a0);
    if ((btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
         *)local_a0._0_8_ !=
        (btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
         *)(local_a0 + 0x10)) {
      operator_delete((void *)local_a0._0_8_,
                      CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
    }
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)local_a0,(ClassNameResolver *)local_80->file_,
               *(Descriptor **)&local_80->field_count_,true);
    text_11._M_str =
         "public Builder mergeFrom($classname$ other) {\n  if (other == $classname$.getDefaultInstance()) return this;\n"
    ;
    text_11._M_len = 0x6c;
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,text_11,(char (*) [10])0x13005f3,(string *)local_a0);
    if ((btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
         *)local_a0._0_8_ !=
        (btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
         *)(local_a0 + 0x10)) {
      operator_delete((void *)local_a0._0_8_,
                      CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
    }
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    pDVar8 = *(Descriptor **)&local_80->field_count_;
    if (0 < pDVar8->field_count_) {
      pFVar1 = (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *)
               &local_80->containing_type_;
      lVar13 = 0;
      lVar15 = 0;
      do {
        bVar7 = IsRealOneof((FieldDescriptor *)(&pDVar8->fields_->super_SymbolBase + lVar13));
        if (!bVar7) {
          if ((*(Descriptor **)&local_80->field_count_)->field_count_ <= lVar15) goto LAB_00e6ccf6;
          pIVar9 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                             (pFVar1,(FieldDescriptor *)
                                     (&(*(Descriptor **)&local_80->field_count_)->fields_->
                                       super_SymbolBase + lVar13));
          (*(pIVar9->super_FieldGenerator)._vptr_FieldGenerator[0xc])(pIVar9,printer);
        }
        lVar15 = lVar15 + 1;
        pDVar8 = *(Descriptor **)&local_80->field_count_;
        lVar13 = lVar13 + 0x58;
      } while (lVar15 < pDVar8->field_count_);
    }
    pFVar1 = local_78;
    iVar17 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
             ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                      *)local_78);
    local_58._M_dataplus._M_p = (pointer)iVar17.node_;
    local_58._M_string_length._0_4_ = iVar17.position_;
    iVar17 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
             ::end((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                    *)pFVar1);
    local_60 = iVar17.node_;
    local_64 = iVar17.position_;
    bVar7 = absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
            ::Equals((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                      *)&local_58,(const_iterator)iVar17);
    if (!bVar7) {
      local_78 = (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *)
                 &local_80->containing_type_;
      do {
        ppVar10 = absl::lts_20250127::container_internal::
                  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                  ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                               *)&local_58);
        oneof = ppVar10->second;
        pOVar11 = Context::GetOneofGeneratorInfo((Context *)(local_80->all_names_).payload_,oneof);
        text_12._M_str = "switch (other.get$oneof_capitalized_name$Case()) {\n";
        text_12._M_len = 0x33;
        io::Printer::Print<char[23],std::__cxx11::string>
                  (printer,text_12,(char (*) [23])"oneof_capitalized_name",
                   &pOVar11->capitalized_name);
        printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
        if (0 < oneof->field_count_) {
          lVar15 = 0;
          lVar13 = 0;
          do {
            pFVar4 = oneof->fields_;
            puVar6 = *(ushort **)((long)&(pFVar4->all_names_).payload_ + lVar15);
            uVar2 = *puVar6;
            local_a0._0_8_ = local_a0 + 0x10;
            local_a0._8_8_ = (Descriptor *)0x0;
            local_90._M_local_buf[0] = '\0';
            std::__cxx11::string::resize((ulong)local_a0,(char)uVar2);
            absl::lts_20250127::ascii_internal::AsciiStrToUpper
                      ((Nonnull<char_*>)local_a0._0_8_,
                       (Nullable<const_char_*>)((long)puVar6 + ~(ulong)uVar2),(ulong)uVar2);
            printer = local_70;
            text_13._M_str = "case $field_name$: {\n";
            text_13._M_len = 0x15;
            io::Printer::Print<char[11],std::__cxx11::string>
                      (local_70,text_13,(char (*) [11])0x132b2b4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                      );
            if ((btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
                 *)local_a0._0_8_ !=
                (btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
                 *)(local_a0 + 0x10)) {
              operator_delete((void *)local_a0._0_8_,
                              CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]
                                      ) + 1);
            }
            printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
            pIVar9 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
                     get(local_78,(FieldDescriptor *)(&pFVar4->super_SymbolBase + lVar15));
            (*(pIVar9->super_FieldGenerator)._vptr_FieldGenerator[0xc])(pIVar9,printer);
            text_14._M_str = "break;\n";
            text_14._M_len = 7;
            io::Printer::Print<>(printer,text_14);
            io::Printer::Outdent(printer);
            text_15._M_str = "}\n";
            text_15._M_len = 2;
            io::Printer::Print<>(printer,text_15);
            lVar13 = lVar13 + 1;
            lVar15 = lVar15 + 0x58;
          } while (lVar13 < oneof->field_count_);
        }
        pOVar11 = Context::GetOneofGeneratorInfo((Context *)(local_80->all_names_).payload_,oneof);
        src = (pOVar11->name)._M_dataplus._M_p;
        n = (pOVar11->name)._M_string_length;
        local_a0._0_8_ = local_a0 + 0x10;
        local_a0._8_8_ = (Descriptor *)0x0;
        local_90._M_local_buf[0] = '\0';
        std::__cxx11::string::resize((ulong)local_a0,(char)n);
        absl::lts_20250127::ascii_internal::AsciiStrToUpper((Nonnull<char_*>)local_a0._0_8_,src,n);
        text_16._M_str = "case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n";
        text_16._M_len = 0x2c;
        io::Printer::Print<char[15],std::__cxx11::string>
                  (printer,text_16,(char (*) [15])"cap_oneof_name",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
        if ((btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
             *)local_a0._0_8_ !=
            (btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
             *)(local_a0 + 0x10)) {
          operator_delete((void *)local_a0._0_8_,
                          CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) +
                          1);
        }
        io::Printer::Outdent(printer);
        text_17._M_str = "}\n";
        text_17._M_len = 2;
        io::Printer::Print<>(printer,text_17);
        absl::lts_20250127::container_internal::
        btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
        ::increment((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                     *)&local_58);
        other_00.position_ = local_64;
        other_00.node_ =
             (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
              *)local_60;
        other_00._12_4_ = 0;
        bVar7 = absl::lts_20250127::container_internal::
                btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                ::Equals((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                          *)&local_58,other_00);
      } while (!bVar7);
    }
    io::Printer::Outdent(printer);
    if (0 < (*(Descriptor **)&local_80->field_count_)->extension_range_count_) {
      text_18._M_str = "  this.mergeExtensionFields(other);\n";
      text_18._M_len = 0x24;
      io::Printer::Print<>(printer,text_18);
    }
    text_19._M_str = "  this.mergeUnknownFields(other.getUnknownFields());\n";
    text_19._M_len = 0x35;
    io::Printer::Print<>(printer,text_19);
    text_20._M_str = "  onChanged();\n";
    text_20._M_len = 0xf;
    io::Printer::Print<>(printer,text_20);
    text_21._M_str = "  return this;\n}\n\n";
    text_21._M_len = 0x12;
    io::Printer::Print<>(printer,text_21);
  }
  return;
LAB_00e6cce9:
  GenerateCommonBuilderMethods();
LAB_00e6ccf6:
  GenerateCommonBuilderMethods();
LAB_00e6cd03:
  GenerateCommonBuilderMethods((MessageBuilderGenerator *)local_a0);
LAB_00e6cd0d:
  protobuf::internal::protobuf_assumption_failed
            ("res != nullptr",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xb31);
}

Assistant:

void MessageBuilderGenerator::GenerateCommonBuilderMethods(
    io::Printer* printer) {
  // Decide if we really need to have the "maybeForceBuilderInitialization()"
  // method.
  // TODO: Remove the need for this entirely
  bool need_maybe_force_builder_init = false;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (descriptor_->field(i)->message_type() != nullptr &&
        !IsRealOneof(descriptor_->field(i)) &&
        HasHasbit(descriptor_->field(i))) {
      need_maybe_force_builder_init = true;
      break;
    }
  }

  const char* force_builder_init = need_maybe_force_builder_init
                                       ? "  maybeForceBuilderInitialization();"
                                       : "";

  printer->Print(
      "// Construct using $classname$.newBuilder()\n"
      "private Builder() {\n"
      "$force_builder_init$\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "force_builder_init", force_builder_init);

  printer->Print(
      "private Builder(\n"
      "    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n"
      "  super(parent);\n"
      "$force_builder_init$\n"
      "}\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "force_builder_init", force_builder_init);

  if (need_maybe_force_builder_init) {
    printer->Print(
        "private void maybeForceBuilderInitialization() {\n"
        "  if (com.google.protobuf.GeneratedMessage\n"
        "          .alwaysUseFieldBuilders) {\n");

    printer->Indent();
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
      if (!IsRealOneof(descriptor_->field(i))) {
        field_generators_.get(descriptor_->field(i))
            .GenerateFieldBuilderInitializationCode(printer);
      }
    }
    printer->Outdent();
    printer->Outdent();

    printer->Print(
        "  }\n"
        "}\n");
  }

  printer->Print(
      "@java.lang.Override\n"
      "public Builder clear() {\n"
      "  super.clear();\n");

  printer->Indent();
  int totalBuilderInts = (descriptor_->field_count() + 31) / 32;
  for (int i = 0; i < totalBuilderInts; i++) {
    printer->Print("$bit_field_name$ = 0;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
        .GenerateBuilderClearCode(printer);
  }

  for (auto& kv : oneofs_) {
    printer->Print(
        "$oneof_name$Case_ = 0;\n"
        "$oneof_name$_ = null;\n",
        "oneof_name", context_->GetOneofGeneratorInfo(kv.second)->name);
  }

  printer->Outdent();

  printer->Print(
      "  return this;\n"
      "}\n"
      "\n");

  printer->Print(
      "@java.lang.Override\n"
      "public com.google.protobuf.Descriptors.Descriptor\n"
      "    getDescriptorForType() {\n"
      "  return $fileclass$.internal_$identifier$_descriptor;\n"
      "}\n"
      "\n",
      "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
      "identifier", UniqueFileScopeIdentifier(descriptor_));

  // LITE runtime implements this in GeneratedMessageLite.
  printer->Print(
      "@java.lang.Override\n"
      "public $classname$ getDefaultInstanceForType() {\n"
      "  return $classname$.getDefaultInstance();\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "@java.lang.Override\n"
      "public $classname$ build() {\n"
      "  $classname$ result = buildPartial();\n"
      "  if (!result.isInitialized()) {\n"
      "    throw newUninitializedMessageException(result);\n"
      "  }\n"
      "  return result;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  GenerateBuildPartial(printer);

  // -----------------------------------------------------------------

  if (context_->HasGeneratedMethods(descriptor_)) {
    printer->Print(
        "@java.lang.Override\n"
        "public Builder mergeFrom(com.google.protobuf.Message other) {\n"
        "  if (other instanceof $classname$) {\n"
        "    return mergeFrom(($classname$)other);\n"
        "  } else {\n"
        "    super.mergeFrom(other);\n"
        "    return this;\n"
        "  }\n"
        "}\n"
        "\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_));

    printer->Print(
        "public Builder mergeFrom($classname$ other) {\n"
        // Optimization:  If other is the default instance, we know none of its
        //   fields are set so we can skip the merge.
        "  if (other == $classname$.getDefaultInstance()) return this;\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_));
    printer->Indent();

    for (int i = 0; i < descriptor_->field_count(); i++) {
      if (!IsRealOneof(descriptor_->field(i))) {
        field_generators_.get(descriptor_->field(i))
            .GenerateMergingCode(printer);
      }
    }

    // Merge oneof fields.
    for (auto& kv : oneofs_) {
      const OneofDescriptor* oneof = kv.second;
      printer->Print("switch (other.get$oneof_capitalized_name$Case()) {\n",
                     "oneof_capitalized_name",
                     context_->GetOneofGeneratorInfo(oneof)->capitalized_name);
      printer->Indent();
      for (int j = 0; j < oneof->field_count(); j++) {
        const FieldDescriptor* field = oneof->field(j);
        printer->Print("case $field_name$: {\n", "field_name",
                       absl::AsciiStrToUpper(field->name()));
        printer->Indent();
        field_generators_.get(field).GenerateMergingCode(printer);
        printer->Print("break;\n");
        printer->Outdent();
        printer->Print("}\n");
      }
      printer->Print(
          "case $cap_oneof_name$_NOT_SET: {\n"
          "  break;\n"
          "}\n",
          "cap_oneof_name",
          absl::AsciiStrToUpper(context_->GetOneofGeneratorInfo(oneof)->name));
      printer->Outdent();
      printer->Print("}\n");
    }

    printer->Outdent();

    // if message type has extensions
    if (descriptor_->extension_range_count() > 0) {
      printer->Print("  this.mergeExtensionFields(other);\n");
    }

    printer->Print("  this.mergeUnknownFields(other.getUnknownFields());\n");

    printer->Print("  onChanged();\n");

    printer->Print(
        "  return this;\n"
        "}\n"
        "\n");
  }
}